

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editline.c
# Opt level: O0

el_status_t h_search(void)

{
  code *pcVar1;
  char *p;
  el_status_t local_c;
  
  if (Searching == 0) {
    Searching = 1;
    clear_line();
    old_prompt = rl_prompt;
    rl_prompt = "Search: ";
    tty_puts("Search: ");
    pcVar1 = el_next_hist;
    if (Repeat == -1) {
      pcVar1 = el_prev_hist;
    }
    search_move = pcVar1;
    if (line_handler == (rl_vcpfunc_t *)0x0) {
      p = editinput(1);
      local_c = h_search_end(p);
    }
    else {
      editinput(0);
      local_c = CSstay;
    }
  }
  else {
    local_c = el_ring_bell();
  }
  return local_c;
}

Assistant:

static el_status_t h_search(void)
{
    if (Searching)
        return el_ring_bell();
    Searching = 1;

    clear_line();
    old_prompt = rl_prompt;
    rl_prompt = "Search: ";
    tty_puts(rl_prompt);

    search_move = Repeat == NO_ARG ? el_prev_hist : el_next_hist;
    if (line_handler) {
        editinput(0);
        return CSstay;
    }

    return h_search_end(editinput(1));
}